

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpSendActionEx(UpnpClient_Handle Hnd,char *ActionURL_const,char *ServiceType_const,
                    char *DevUDN_const,IXML_Document *Header,IXML_Document *Action,
                    IXML_Document **RespNodePtr)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  char *ServiceType;
  char *ActionURL;
  Handle_Info *pHStack_40;
  int retVal;
  Handle_Info *SInfo;
  IXML_Document *Action_local;
  IXML_Document *Header_local;
  char *DevUDN_const_local;
  char *ServiceType_const_local;
  char *ActionURL_const_local;
  UpnpClient_Handle Hnd_local;
  
  pHStack_40 = (Handle_Info *)0x0;
  if (UpnpSdkInit == 1) {
    SInfo = (Handle_Info *)Action;
    Action_local = Header;
    Header_local = (IXML_Document *)DevUDN_const;
    DevUDN_const_local = ServiceType_const;
    ServiceType_const_local = ActionURL_const;
    ActionURL_const_local._0_4_ = Hnd;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xb84,"Inside UpnpSendActionEx\n");
    if (Action_local == (IXML_Document *)0x0) {
      ActionURL_const_local._4_4_ =
           UpnpSendAction((UpnpClient_Handle)ActionURL_const_local,ServiceType_const_local,
                          DevUDN_const_local,(char *)Header_local,(IXML_Document *)SInfo,RespNodePtr
                         );
    }
    else {
      HandleReadLock(".upnp/src/api/upnpapi.c",0xb90);
      UVar1 = GetHandleInfo((UpnpClient_Handle)ActionURL_const_local,&stack0xffffffffffffffc0);
      if (UVar1 == HND_CLIENT) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xb98);
        if (ActionURL_const == (char *)0x0) {
          ActionURL_const_local._4_4_ = -0x65;
        }
        else if (((ServiceType_const == (char *)0x0) || (SInfo == (Handle_Info *)0x0)) ||
                (RespNodePtr == (IXML_Document **)0x0)) {
          ActionURL_const_local._4_4_ = -0x65;
        }
        else {
          iVar2 = SoapSendActionEx(ActionURL_const,ServiceType_const,Action_local,
                                   (IXML_Document *)SInfo,RespNodePtr);
          UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xba5,"Exiting UpnpSendAction \n");
          ActionURL_const_local._4_4_ = iVar2;
        }
      }
      else {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xb95);
        ActionURL_const_local._4_4_ = -100;
      }
    }
  }
  else {
    ActionURL_const_local._4_4_ = -0x74;
  }
  return ActionURL_const_local._4_4_;
}

Assistant:

int UpnpSendActionEx(UpnpClient_Handle Hnd,
	const char *ActionURL_const,
	const char *ServiceType_const,
	const char *DevUDN_const,
	IXML_Document *Header,
	IXML_Document *Action,
	IXML_Document **RespNodePtr)
{
	struct Handle_Info *SInfo = NULL;
	int retVal = 0;
	char *ActionURL = (char *)ActionURL_const;
	char *ServiceType = (char *)ServiceType_const;
	/* udn not used? */
	/*char *DevUDN = (char *)DevUDN_const;*/

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(
		UPNP_ALL, API, __FILE__, __LINE__, "Inside UpnpSendActionEx\n");

	if (Header == NULL) {
		retVal = UpnpSendAction(Hnd,
			ActionURL_const,
			ServiceType_const,
			DevUDN_const,
			Action,
			RespNodePtr);
		return retVal;
	}

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	HandleUnlock(__FILE__, __LINE__);

	if (ActionURL == NULL) {
		return UPNP_E_INVALID_PARAM;
	}
	if (ServiceType == NULL || Action == NULL || RespNodePtr == NULL) {
		return UPNP_E_INVALID_PARAM;
	}

	retVal = SoapSendActionEx(
		ActionURL, ServiceType, Header, Action, RespNodePtr);

	UpnpPrintf(
		UPNP_ALL, API, __FILE__, __LINE__, "Exiting UpnpSendAction \n");

	return retVal;
}